

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_actionfunctions.cpp
# Opt level: O0

int AF_AStateProvider_A_FireBullets
              (VMValue *param,TArray<VMValue,_VMValue> *defaultparam,int numparam,VMReturn *ret,
              int numret)

{
  APlayerPawn *this;
  DObject *this_00;
  void *pvVar1;
  player_t *ppVar2;
  AWeapon *this_01;
  AActor *x;
  double y;
  int iVar3;
  int iVar4;
  VMValue *pVVar5;
  bool bVar6;
  bool local_1d2;
  bool local_1cf;
  FName local_1cc;
  TAngle<double> local_1c8;
  TAngle<double> local_1c0;
  TAngle<double> local_1b8;
  AActor *local_1b0;
  AActor *proj_1;
  DVector2 ofs_1;
  DAngle ang_1;
  bool temp_1;
  TAngle<double> local_180;
  AActor *local_178;
  AActor *puff_1;
  int damage_1;
  TAngle<double> local_160;
  TAngle<double> local_158;
  TAngle<double> local_150;
  TAngle<double> local_148;
  DAngle slope;
  DAngle angle;
  TAngle<double> local_130;
  TAngle<double> local_128;
  TAngle<double> local_120;
  AActor *local_118;
  AActor *proj;
  DVector2 ofs;
  DAngle ang;
  bool temp;
  TAngle<double> local_e8;
  AActor *local_e0;
  AActor *puff;
  int damage;
  uint local_c4;
  int laflags;
  DAngle bslope;
  DAngle bangle;
  int i;
  AWeapon *weapon;
  player_t *player;
  double Spawnofs_xy;
  double Spawnheight;
  MetaClass *missile;
  double range;
  PClassActor *pPStack_70;
  int flags;
  MetaClass *pufftype;
  int damageperbullet;
  int numbullets;
  DAngle spread_z;
  DAngle spread_xy;
  FStateParamInfo *stateinfo;
  AStateProvider *stateowner;
  AActor *self;
  int paramnum;
  int numret_local;
  VMReturn *ret_local;
  int numparam_local;
  TArray<VMValue,_VMValue> *defaultparam_local;
  VMValue *param_local;
  
  if (numparam < 1) {
    __assert_fail("(paramnum) < numparam",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                  ,0x747,
                  "int AF_AStateProvider_A_FireBullets(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                 );
  }
  bVar6 = false;
  if (((param->field_0).field_3.Type == '\x03') &&
     (bVar6 = true, (param->field_0).field_1.atag != 1)) {
    bVar6 = (param->field_0).field_1.a == (void *)0x0;
  }
  if (!bVar6) {
    __assert_fail("param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                  ,0x747,
                  "int AF_AStateProvider_A_FireBullets(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                 );
  }
  this = *(APlayerPawn **)&param->field_0;
  local_1cf = true;
  if (this != (APlayerPawn *)0x0) {
    local_1cf = DObject::IsKindOf((DObject *)this,AActor::RegistrationInfo.MyClass);
  }
  if (local_1cf == false) {
    __assert_fail("self == NULL || self->IsKindOf(RUNTIME_CLASS(AActor))",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                  ,0x747,
                  "int AF_AStateProvider_A_FireBullets(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                 );
  }
  if (numparam < 2) {
    __assert_fail("(paramnum) < numparam",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                  ,0x747,
                  "int AF_AStateProvider_A_FireBullets(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                 );
  }
  bVar6 = false;
  if ((param[1].field_0.field_3.Type == '\x03') &&
     (bVar6 = true, param[1].field_0.field_1.atag != 1)) {
    bVar6 = param[1].field_0.field_1.a == (void *)0x0;
  }
  if (!bVar6) {
    __assert_fail("param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                  ,0x747,
                  "int AF_AStateProvider_A_FireBullets(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                 );
  }
  this_00 = (DObject *)param[1].field_0.field_1.a;
  local_1d2 = true;
  if (this_00 != (DObject *)0x0) {
    local_1d2 = DObject::IsKindOf(this_00,AStateProvider::RegistrationInfo.MyClass);
  }
  if (local_1d2 == false) {
    __assert_fail("stateowner == NULL || stateowner->IsKindOf(RUNTIME_CLASS(AStateProvider))",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                  ,0x747,
                  "int AF_AStateProvider_A_FireBullets(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                 );
  }
  if (numparam < 3) {
    __assert_fail("(paramnum) < numparam",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                  ,0x747,
                  "int AF_AStateProvider_A_FireBullets(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                 );
  }
  if (param[2].field_0.field_3.Type != '\x03') {
    __assert_fail("param[paramnum].Type == REGT_POINTER",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                  ,0x747,
                  "int AF_AStateProvider_A_FireBullets(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                 );
  }
  pvVar1 = param[2].field_0.field_1.a;
  if (numparam < 4) {
    __assert_fail("(paramnum) < numparam",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                  ,0x748,
                  "int AF_AStateProvider_A_FireBullets(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                 );
  }
  if (param[3].field_0.field_3.Type != '\x01') {
    __assert_fail("param[paramnum].Type == REGT_FLOAT",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                  ,0x748,
                  "int AF_AStateProvider_A_FireBullets(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                 );
  }
  TAngle<double>::TAngle(&spread_z,param[3].field_0.f);
  if (numparam < 5) {
    __assert_fail("(paramnum) < numparam",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                  ,0x749,
                  "int AF_AStateProvider_A_FireBullets(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                 );
  }
  if (param[4].field_0.field_3.Type == '\x01') {
    TAngle<double>::TAngle((TAngle<double> *)&damageperbullet,param[4].field_0.f);
    if (numparam < 6) {
      __assert_fail("(paramnum) < numparam",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                    ,0x74a,
                    "int AF_AStateProvider_A_FireBullets(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                   );
    }
    if (param[5].field_0.field_3.Type != '\0') {
      __assert_fail("param[paramnum].Type == REGT_INT",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                    ,0x74a,
                    "int AF_AStateProvider_A_FireBullets(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                   );
    }
    pufftype._4_4_ = param[5].field_0.i;
    if (numparam < 7) {
      __assert_fail("(paramnum) < numparam",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                    ,0x74b,
                    "int AF_AStateProvider_A_FireBullets(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                   );
    }
    if (param[6].field_0.field_3.Type == '\0') {
      iVar3 = param[6].field_0.i;
      if (numparam < 8) {
        pVVar5 = TArray<VMValue,_VMValue>::operator[](defaultparam,7);
        bVar6 = false;
        if ((pVVar5->field_0).field_3.Type == '\x03') {
          pVVar5 = TArray<VMValue,_VMValue>::operator[](defaultparam,7);
          bVar6 = true;
          if ((pVVar5->field_0).field_1.atag != 1) {
            pVVar5 = TArray<VMValue,_VMValue>::operator[](defaultparam,7);
            bVar6 = (pVVar5->field_0).field_1.a == (void *)0x0;
          }
        }
        if (!bVar6) {
          __assert_fail("(defaultparam[paramnum]).Type == REGT_POINTER && ((defaultparam[paramnum]).atag == ATAG_OBJECT || (defaultparam[paramnum]).a == nullptr)"
                        ,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                        ,0x74c,
                        "int AF_AStateProvider_A_FireBullets(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                       );
        }
        pVVar5 = TArray<VMValue,_VMValue>::operator[](defaultparam,7);
        pPStack_70 = (PClassActor *)(pVVar5->field_0).field_1.a;
      }
      else {
        bVar6 = false;
        if ((param[7].field_0.field_3.Type == '\x03') &&
           (bVar6 = true, param[7].field_0.field_1.atag != 1)) {
          bVar6 = param[7].field_0.field_1.a == (void *)0x0;
        }
        if (!bVar6) {
          __assert_fail("(param[paramnum]).Type == REGT_POINTER && ((param[paramnum]).atag == ATAG_OBJECT || (param[paramnum]).a == nullptr)"
                        ,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                        ,0x74c,
                        "int AF_AStateProvider_A_FireBullets(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                       );
        }
        pPStack_70 = (PClassActor *)param[7].field_0.field_1.a;
      }
      if (numparam < 9) {
        pVVar5 = TArray<VMValue,_VMValue>::operator[](defaultparam,8);
        if ((pVVar5->field_0).field_3.Type != '\0') {
          __assert_fail("(defaultparam[paramnum]).Type == REGT_INT",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                        ,0x74d,
                        "int AF_AStateProvider_A_FireBullets(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                       );
        }
        pVVar5 = TArray<VMValue,_VMValue>::operator[](defaultparam,8);
        range._4_4_ = (pVVar5->field_0).i;
      }
      else {
        if (param[8].field_0.field_3.Type != '\0') {
          __assert_fail("(param[paramnum]).Type == REGT_INT",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                        ,0x74d,
                        "int AF_AStateProvider_A_FireBullets(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                       );
        }
        range._4_4_ = param[8].field_0.i;
      }
      if (numparam < 10) {
        pVVar5 = TArray<VMValue,_VMValue>::operator[](defaultparam,9);
        if ((pVVar5->field_0).field_3.Type != '\x01') {
          __assert_fail("(defaultparam[paramnum]).Type == REGT_FLOAT",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                        ,0x74e,
                        "int AF_AStateProvider_A_FireBullets(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                       );
        }
        pVVar5 = TArray<VMValue,_VMValue>::operator[](defaultparam,9);
        missile = (MetaClass *)(pVVar5->field_0).field_1.a;
      }
      else {
        if (param[9].field_0.field_3.Type != '\x01') {
          __assert_fail("(param[paramnum]).Type == REGT_FLOAT",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                        ,0x74e,
                        "int AF_AStateProvider_A_FireBullets(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                       );
        }
        missile = (MetaClass *)param[9].field_0.field_1.a;
      }
      if (numparam < 0xb) {
        pVVar5 = TArray<VMValue,_VMValue>::operator[](defaultparam,10);
        bVar6 = false;
        if ((pVVar5->field_0).field_3.Type == '\x03') {
          pVVar5 = TArray<VMValue,_VMValue>::operator[](defaultparam,10);
          bVar6 = true;
          if ((pVVar5->field_0).field_1.atag != 1) {
            pVVar5 = TArray<VMValue,_VMValue>::operator[](defaultparam,10);
            bVar6 = (pVVar5->field_0).field_1.a == (void *)0x0;
          }
        }
        if (!bVar6) {
          __assert_fail("(defaultparam[paramnum]).Type == REGT_POINTER && ((defaultparam[paramnum]).atag == ATAG_OBJECT || (defaultparam[paramnum]).a == nullptr)"
                        ,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                        ,0x74f,
                        "int AF_AStateProvider_A_FireBullets(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                       );
        }
        pVVar5 = TArray<VMValue,_VMValue>::operator[](defaultparam,10);
        Spawnheight = (pVVar5->field_0).f;
      }
      else {
        bVar6 = false;
        if ((param[10].field_0.field_3.Type == '\x03') &&
           (bVar6 = true, param[10].field_0.field_1.atag != 1)) {
          bVar6 = param[10].field_0.field_1.a == (void *)0x0;
        }
        if (!bVar6) {
          __assert_fail("(param[paramnum]).Type == REGT_POINTER && ((param[paramnum]).atag == ATAG_OBJECT || (param[paramnum]).a == nullptr)"
                        ,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                        ,0x74f,
                        "int AF_AStateProvider_A_FireBullets(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                       );
        }
        Spawnheight = param[10].field_0.f;
      }
      if (numparam < 0xc) {
        pVVar5 = TArray<VMValue,_VMValue>::operator[](defaultparam,0xb);
        if ((pVVar5->field_0).field_3.Type != '\x01') {
          __assert_fail("(defaultparam[paramnum]).Type == REGT_FLOAT",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                        ,0x750,
                        "int AF_AStateProvider_A_FireBullets(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                       );
        }
        pVVar5 = TArray<VMValue,_VMValue>::operator[](defaultparam,0xb);
        Spawnofs_xy = (pVVar5->field_0).f;
      }
      else {
        if (param[0xb].field_0.field_3.Type != '\x01') {
          __assert_fail("(param[paramnum]).Type == REGT_FLOAT",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                        ,0x750,
                        "int AF_AStateProvider_A_FireBullets(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                       );
        }
        Spawnofs_xy = param[0xb].field_0.f;
      }
      if (numparam < 0xd) {
        pVVar5 = TArray<VMValue,_VMValue>::operator[](defaultparam,0xc);
        if ((pVVar5->field_0).field_3.Type != '\x01') {
          __assert_fail("(defaultparam[paramnum]).Type == REGT_FLOAT",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                        ,0x751,
                        "int AF_AStateProvider_A_FireBullets(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                       );
        }
        pVVar5 = TArray<VMValue,_VMValue>::operator[](defaultparam,0xc);
        player = (player_t *)(pVVar5->field_0).field_1.a;
      }
      else {
        if (param[0xc].field_0.field_3.Type != '\x01') {
          __assert_fail("(param[paramnum]).Type == REGT_FLOAT",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                        ,0x751,
                        "int AF_AStateProvider_A_FireBullets(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                       );
        }
        player = (player_t *)param[0xc].field_0.field_1.a;
      }
      if ((this->super_AActor).player != (player_t *)0x0) {
        ppVar2 = (this->super_AActor).player;
        this_01 = ppVar2->ReadyWeapon;
        TAngle<double>::TAngle(&bslope);
        TAngle<double>::TAngle((TAngle<double> *)&stack0xffffffffffffff40,0.0);
        local_c4 = 0;
        if ((range._4_4_ & 0x20) != 0) {
          local_c4 = 2;
        }
        if (((((range._4_4_ & 1) == 0) || (this_01 == (AWeapon *)0x0)) ||
            ((this->super_AActor).player == (player_t *)0x0)) ||
           (((pvVar1 == (void *)0x0 || (*(int *)((long)pvVar1 + 8) != 1)) ||
            (bVar6 = AWeapon::DepleteAmmo(this_01,(bool)(this_01->bAltFire & 1),true,-1), bVar6))))
        {
          if (((double)missile == 0.0) && (!NAN((double)missile))) {
            missile = (MetaClass *)0x40c0000000000000;
          }
          if ((range._4_4_ & 0x10) == 0) {
            APlayerPawn::PlayAttacking2(this);
          }
          if ((range._4_4_ & 8) == 0) {
            P_BulletSlope((AActor *)&damage,(FTranslatedLineTarget *)this,0);
            TAngle<double>::operator=
                      ((TAngle<double> *)&stack0xffffffffffffff40,(TAngle<double> *)&damage);
          }
          TAngle<double>::operator=(&bslope,&(this->super_AActor).Angles.Yaw);
          if (pPStack_70 == (PClassActor *)0x0) {
            pPStack_70 = PClass::FindActor(NAME_BulletPuff);
          }
          if (this_01 != (AWeapon *)0x0) {
            FSoundID::FSoundID((FSoundID *)((long)&puff + 4),
                               &(this_01->super_AStateProvider).super_AInventory.super_AActor.
                                AttackSound.super_FSoundID);
            S_Sound(&this->super_AActor,1,(FSoundID *)((long)&puff + 4),1.0,1.0);
          }
          if (((pufftype._4_4_ == 1) && (ppVar2->refire == 0)) || (pufftype._4_4_ == 0)) {
            puff._0_4_ = iVar3;
            if ((range._4_4_ & 2) == 0) {
              iVar3 = FRandom::operator()(&pr_cwbullet);
              puff._0_4_ = (iVar3 % 3 + 1) * (int)puff;
            }
            TAngle<double>::TAngle(&local_e8,&bslope);
            TAngle<double>::TAngle
                      ((TAngle<double> *)&stack0xffffffffffffff10,
                       (TAngle<double> *)&stack0xffffffffffffff40);
            iVar3 = (int)puff;
            FName::FName((FName *)((long)&ang.Degrees + 4),NAME_Hitscan);
            local_e0 = P_LineAttack(&this->super_AActor,&local_e8,(double)missile,
                                    (DAngle *)&stack0xffffffffffffff10,iVar3,
                                    (FName *)((long)&ang.Degrees + 4),pPStack_70,local_c4,
                                    (FTranslatedLineTarget *)0x0,(int *)0x0);
            if (Spawnheight != 0.0) {
              ang.Degrees._3_1_ = 0;
              TAngle<double>::operator-((TAngle<double> *)&ofs.Y,90.0);
              TAngle<double>::ToVector((TAngle<double> *)&proj,(double)player);
              TAngle<double>::TAngle(&local_120,&bslope);
              local_118 = P_SpawnPlayerMissile
                                    (&this->super_AActor,(double)proj,ofs.X,Spawnofs_xy,
                                     (PClassActor *)Spawnheight,&local_120,
                                     (FTranslatedLineTarget *)0x0,(AActor **)0x0,false,true,0);
              if (local_118 != (AActor *)0x0) {
                if (local_e0 == (AActor *)0x0) {
                  ang.Degrees._3_1_ = 1;
                  TAngle<double>::TAngle(&local_128,&bslope);
                  TAngle<double>::TAngle(&local_130,(TAngle<double> *)&stack0xffffffffffffff40);
                  FName::FName((FName *)((long)&angle.Degrees + 4),NAME_Hitscan);
                  local_e0 = P_LineAttack(&this->super_AActor,&local_128,(double)missile,&local_130,
                                          0,(FName *)((long)&angle.Degrees + 4),pPStack_70,
                                          local_c4 | 8,(FTranslatedLineTarget *)0x0,(int *)0x0);
                }
                AimBulletMissile(local_118,local_e0,range._4_4_,(bool)(ang.Degrees._3_1_ & 1),false)
                ;
              }
            }
          }
          else {
            if (pufftype._4_4_ < 0) {
              pufftype._4_4_ = 1;
            }
            for (bangle.Degrees._4_4_ = 0; bangle.Degrees._4_4_ < pufftype._4_4_;
                bangle.Degrees._4_4_ = bangle.Degrees._4_4_ + 1) {
              TAngle<double>::TAngle(&slope,&bslope);
              TAngle<double>::TAngle(&local_148,(TAngle<double> *)&stack0xffffffffffffff40);
              if ((range._4_4_ & 4) == 0) {
                iVar4 = FRandom::Random2(&pr_cwbullet);
                TAngle<double>::operator*(&local_160,(double)iVar4 / 255.0);
                TAngle<double>::operator+=(&slope,&local_160);
                iVar4 = FRandom::Random2(&pr_cwbullet);
                TAngle<double>::operator*
                          ((TAngle<double> *)&stack0xfffffffffffffe98,(double)iVar4 / 255.0);
                TAngle<double>::operator+=(&local_148,(TAngle<double> *)&stack0xfffffffffffffe98);
              }
              else {
                TAngle<double>::TAngle(&local_150,&spread_z);
                TAngle<double>::operator+=(&slope,&local_150);
                TAngle<double>::TAngle(&local_158,(TAngle<double> *)&damageperbullet);
                TAngle<double>::operator+=(&local_148,&local_158);
              }
              puff_1._4_4_ = iVar3;
              if ((range._4_4_ & 2) == 0) {
                iVar4 = FRandom::operator()(&pr_cwbullet);
                puff_1._4_4_ = (iVar4 % 3 + 1) * puff_1._4_4_;
              }
              TAngle<double>::TAngle(&local_180,&slope);
              TAngle<double>::TAngle((TAngle<double> *)&stack0xfffffffffffffe78,&local_148);
              iVar4 = puff_1._4_4_;
              FName::FName((FName *)((long)&ang_1.Degrees + 4),NAME_Hitscan);
              local_178 = P_LineAttack(&this->super_AActor,&local_180,(double)missile,
                                       (DAngle *)&stack0xfffffffffffffe78,iVar4,
                                       (FName *)((long)&ang_1.Degrees + 4),pPStack_70,local_c4,
                                       (FTranslatedLineTarget *)0x0,(int *)0x0);
              if (Spawnheight != 0.0) {
                ang_1.Degrees._3_1_ = 0;
                TAngle<double>::operator-((TAngle<double> *)&ofs_1.Y,90.0);
                TAngle<double>::ToVector((TAngle<double> *)&proj_1,(double)player);
                y = ofs_1.X;
                x = proj_1;
                TAngle<double>::TAngle(&local_1b8,&slope);
                local_1b0 = P_SpawnPlayerMissile
                                      (&this->super_AActor,(double)x,y,Spawnofs_xy,
                                       (PClassActor *)Spawnheight,&local_1b8,
                                       (FTranslatedLineTarget *)0x0,(AActor **)0x0,false,true,0);
                if (local_1b0 != (AActor *)0x0) {
                  if (local_178 == (AActor *)0x0) {
                    ang_1.Degrees._3_1_ = 1;
                    TAngle<double>::TAngle(&local_1c0,&slope);
                    TAngle<double>::TAngle(&local_1c8,&local_148);
                    FName::FName(&local_1cc,NAME_Hitscan);
                    local_178 = P_LineAttack(&this->super_AActor,&local_1c0,(double)missile,
                                             &local_1c8,0,&local_1cc,pPStack_70,local_c4 | 8,
                                             (FTranslatedLineTarget *)0x0,(int *)0x0);
                  }
                  AimBulletMissile(local_1b0,local_178,range._4_4_,(bool)(ang_1.Degrees._3_1_ & 1),
                                   false);
                }
              }
            }
          }
        }
      }
      return 0;
    }
    __assert_fail("param[paramnum].Type == REGT_INT",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                  ,0x74b,
                  "int AF_AStateProvider_A_FireBullets(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                 );
  }
  __assert_fail("param[paramnum].Type == REGT_FLOAT",
                "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                ,0x749,
                "int AF_AStateProvider_A_FireBullets(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
               );
}

Assistant:

DEFINE_ACTION_FUNCTION(AStateProvider, A_FireBullets)
{
	PARAM_ACTION_PROLOGUE(AStateProvider);
	PARAM_ANGLE		(spread_xy);
	PARAM_ANGLE		(spread_z);
	PARAM_INT		(numbullets);
	PARAM_INT		(damageperbullet);
	PARAM_CLASS_DEF	(pufftype, AActor);
	PARAM_INT_DEF	(flags);
	PARAM_FLOAT_DEF	(range);
	PARAM_CLASS_DEF (missile, AActor);
	PARAM_FLOAT_DEF (Spawnheight);
	PARAM_FLOAT_DEF (Spawnofs_xy);

	if (!self->player) return 0;

	player_t *player = self->player;
	AWeapon *weapon = player->ReadyWeapon;

	int i;
	DAngle bangle;
	DAngle bslope = 0.;
	int laflags = (flags & FBF_NORANDOMPUFFZ)? LAF_NORANDOMPUFFZ : 0;

	if ((flags & FBF_USEAMMO) && weapon && ACTION_CALL_FROM_PSPRITE())
	{
		if (!weapon->DepleteAmmo(weapon->bAltFire, true))
			return 0;	// out of ammo
	}
	
	if (range == 0)	range = PLAYERMISSILERANGE;

	if (!(flags & FBF_NOFLASH)) static_cast<APlayerPawn *>(self)->PlayAttacking2 ();

	if (!(flags & FBF_NOPITCH)) bslope = P_BulletSlope(self);
	bangle = self->Angles.Yaw;

	if (pufftype == NULL) pufftype = PClass::FindActor(NAME_BulletPuff);

	if (weapon != NULL)
	{
		S_Sound(self, CHAN_WEAPON, weapon->AttackSound, 1, ATTN_NORM);
	}

	if ((numbullets == 1 && !player->refire) || numbullets == 0)
	{
		int damage = damageperbullet;

		if (!(flags & FBF_NORANDOM))
			damage *= ((pr_cwbullet()%3)+1);

		AActor *puff = P_LineAttack(self, bangle, range, bslope, damage, NAME_Hitscan, pufftype, laflags);

		if (missile != nullptr)
		{
			bool temp = false;
			DAngle ang = self->Angles.Yaw - 90;
			DVector2 ofs = ang.ToVector(Spawnofs_xy);
			AActor *proj = P_SpawnPlayerMissile(self, ofs.X, ofs.Y, Spawnheight, missile, bangle, nullptr, nullptr, false, true);
			if (proj)
			{
				if (!puff)
				{
					temp = true;
					puff = P_LineAttack(self, bangle, range, bslope, 0, NAME_Hitscan, pufftype, laflags | LAF_NOINTERACT);
				}
				AimBulletMissile(proj, puff, flags, temp, false);
			}
		}
	}
	else 
	{
		if (numbullets < 0)
			numbullets = 1;
		for (i = 0; i < numbullets; i++)
		{
			DAngle angle = bangle;
			DAngle slope = bslope;

			if (flags & FBF_EXPLICITANGLE)
			{
				angle += spread_xy;
				slope += spread_z;
			}
			else
			{
				angle += spread_xy * (pr_cwbullet.Random2() / 255.);
				slope += spread_z * (pr_cwbullet.Random2() / 255.);
			}

			int damage = damageperbullet;

			if (!(flags & FBF_NORANDOM))
				damage *= ((pr_cwbullet()%3)+1);

			AActor *puff = P_LineAttack(self, angle, range, slope, damage, NAME_Hitscan, pufftype, laflags);

			if (missile != nullptr)
			{
				bool temp = false;
				DAngle ang = self->Angles.Yaw - 90;
				DVector2 ofs = ang.ToVector(Spawnofs_xy);
				AActor *proj = P_SpawnPlayerMissile(self, ofs.X, ofs.Y, Spawnheight, missile, angle, nullptr, nullptr, false, true);
				if (proj)
				{
					if (!puff)
					{
						temp = true;
						puff = P_LineAttack(self, angle, range, slope, 0, NAME_Hitscan, pufftype, laflags | LAF_NOINTERACT);
					}
					AimBulletMissile(proj, puff, flags, temp, false);
				}
			}
		}
	}
	return 0;
}